

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_pow.c
# Opt level: O2

word zzPowerModW(word a,word b,word mod,void *stack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong uVar15;
  ulong uVar16;
  undefined8 uVar17;
  size_t sVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  
  if (b == 0) {
    uVar15 = 1;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = a;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = a;
    uVar15 = __umodti3(SUB168(auVar1 * auVar8,0),SUB168(auVar1 * auVar8,8),mod,0);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar15;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = a;
    uVar16 = __umodti3(SUB168(auVar2 * auVar9,0),SUB168(auVar2 * auVar9,8),mod,0);
    *(ulong *)((long)stack + 8) = uVar16;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar16;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar15;
    uVar16 = __umodti3(SUB168(auVar3 * auVar10,0),SUB168(auVar3 * auVar10,8),mod,0);
    *(ulong *)((long)stack + 0x10) = uVar16;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar16;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar15;
    uVar17 = __umodti3(SUB168(auVar4 * auVar11,0),SUB168(auVar4 * auVar11,8),mod,0);
    *(undefined8 *)((long)stack + 0x18) = uVar17;
    *(word *)stack = a;
    sVar18 = u64CLZ(b);
    uVar16 = 0x40 - sVar18;
    uVar15 = 3;
    if (uVar16 < 3) {
      uVar15 = uVar16;
    }
    uVar21 = 0x3f - (uVar15 + sVar18);
    uVar15 = (ulong)((uint)(b >> ((char)uVar16 - (byte)uVar15 & 0x3f)) &
                    ~(-1 << ((byte)uVar15 & 0x1f)));
    while ((uVar15 & 1) == 0) {
      uVar21 = uVar21 + 1;
      uVar15 = uVar15 >> 1;
    }
    uVar15 = *(ulong *)((long)stack + (uVar15 >> 1) * 8);
    while (uVar21 != 0xffffffffffffffff) {
      if ((b >> (uVar21 & 0x3f) & 1) == 0) {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar15;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = uVar15;
        uVar15 = __umodti3(SUB168(auVar7 * auVar14,0),SUB168(auVar7 * auVar14,8),mod,0);
        uVar21 = uVar21 - 1;
      }
      else {
        uVar16 = uVar21 + 1;
        uVar20 = 3;
        if (uVar16 < 3) {
          uVar20 = uVar16;
        }
        for (uVar16 = (ulong)((uint)(b >> ((char)uVar16 - (byte)uVar20 & 0x3f)) &
                             ~(-1 << ((byte)uVar20 & 0x1f))); (uVar16 & 1) == 0;
            uVar16 = uVar16 >> 1) {
          uVar20 = uVar20 - 1;
        }
        uVar19 = 0;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = uVar15;
        while( true ) {
          uVar15 = auVar22._0_8_;
          if (uVar20 == uVar19) break;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar15;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = uVar15;
          auVar22 = __umodti3(SUB168(auVar5 * auVar12,0),
                              auVar22._8_8_ * uVar15 + SUB168(auVar5 * auVar12,8),mod,0);
          uVar19 = uVar19 + 1;
        }
        uVar21 = uVar21 - uVar20;
        uVar16 = *(ulong *)((long)stack + (uVar16 & 0xfffffffffffffffe) * 4);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar15;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = uVar16;
        uVar15 = __umodti3(SUB168(auVar6 * auVar13,0),
                           auVar22._8_8_ * uVar16 + SUB168(auVar6 * auVar13,8),mod,0);
      }
    }
  }
  return uVar15;
}

Assistant:

word zzPowerModW(register word a, register word b, register word mod, 
	void* stack)
{
	register dword prod;
	register word slide;
	register size_t pos;
	register size_t slide_size;
	// переменные в stack
	word* powers;	/* [4]powers */
	// pre
	ASSERT(mod != 0);
	// b == 0?
	if (b == 0)
		return 1;
	// раскладка stack
	powers = (word*)stack;
	// powers <- малые нечетные степени a
	prod = a;
	prod *= a, prod %= mod, powers[0] = (word)prod;
	prod *= a, prod %= mod, powers[1] = (word)prod;
	prod *= powers[0], prod %= mod, powers[2] = (word)prod;
	prod *= powers[0], prod %= mod, powers[3] = (word)prod;
	powers[0] = a;
	// pos <- номер старшего единичного бита b
	pos = B_PER_W - 1 - wordCLZ(b);
	// slide <- старший слайд b
	slide_size = MIN2(pos + 1, 3);
	slide = b >> (pos + 1 - slide_size);
	slide &= WORD_BIT_POS(slide_size) - 1;
	for (; slide % 2 == 0; slide >>= 1, slide_size--);
	// a <- powers[slide / 2]
	a = powers[slide / 2];
	pos -= slide_size;
	// пробегаем биты b
	while (pos != SIZE_MAX)
	{
		prod = a;
		if ((b & WORD_BIT_POS(pos)) == 0)
		{
			// a <- a^2 \mod mod
			prod *= a, a = prod % mod;
			--pos;
		}
		else
		{
			// slide <- очередной слайд b
			slide_size = MIN2(pos + 1, 3);
			slide = b >> (pos + 1 - slide_size);
			slide &= WORD_BIT_POS(slide_size) - 1;
			for (; slide % 2 == 0; slide >>= 1, slide_size--);
			pos -= slide_size;
			// a <- a^2 \mod mod
			while (slide_size--)
				prod *= a, prod %= mod, a = (word)prod;
			// a <- a * powers[slide / 2] \mod mod
			prod *= powers[slide / 2];
			prod %= mod;
			a = (word)prod;
		}
	}
	// выход
	prod = 0, slide = b = mod = 0, pos = slide_size = 0;
	return a;
}